

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

void * LZ4_createHC(char *inputBuffer)

{
  void *pvVar1;
  
  pvVar1 = calloc(1,0x40038);
  if (pvVar1 != (void *)0x0) {
    *(undefined2 *)((long)pvVar1 + 0x40024) = 9;
    *(undefined4 *)((long)pvVar1 + 0x40020) = 0x10000;
    *(char **)((long)pvVar1 + 0x40008) = inputBuffer + -0x10000;
    *(char **)((long)pvVar1 + 0x40000) = inputBuffer;
    *(char **)((long)pvVar1 + 0x40010) = inputBuffer + -0x10000;
    *(undefined8 *)((long)pvVar1 + 0x40018) = 0x1000000010000;
  }
  return pvVar1;
}

Assistant:

void* LZ4_createHC (const char* inputBuffer)
{
    LZ4_streamHC_t* const hc4 = LZ4_createStreamHC();
    if (hc4 == NULL) return NULL;   /* not enough memory */
    LZ4HC_init_internal (&hc4->internal_donotuse, (const BYTE*)inputBuffer);
    return hc4;
}